

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_visitor_test.cc:132:20)>_>
::Visit<google::protobuf::DescriptorProto>
          (VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_descriptor_visitor_test_cc:132:20)>_>
           *this,Descriptor *descriptor,DescriptorProto *proto)

{
  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *this_00;
  ushort *puVar1;
  EnumDescriptor *descriptor_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_00;
  Descriptor *descriptor_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_01;
  int i;
  int iVar2;
  char *pcVar3;
  AssertHelper AStack_58;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  AssertionResult gtest_ar;
  
  this_00 = (vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
             *)(this->visitor).super_anon_class_8_1_aac68544.descriptors;
  if (this_00 !=
      (vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
       *)0x0) {
    pcVar3 = (descriptor->all_names_).payload_;
    gtest_ar._0_8_ = ZEXT28(*(ushort *)(pcVar3 + 2));
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(~gtest_ar._0_8_ + (long)pcVar3);
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
              (this_00,(basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar);
  }
  puVar1 = (ushort *)(descriptor->all_names_).payload_;
  local_50._M_len = (size_t)*puVar1;
  local_50._M_str = (char *)((long)puVar1 + ~local_50._M_len);
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
            ((internal *)&gtest_ar,"message.name()","proto.name()",&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_visitor_test.cc"
               ,0x75,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if ((long *)local_50._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_len + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  for (iVar2 = 0; iVar2 < descriptor->enum_type_count_; iVar2 = iVar2 + 1) {
    descriptor_00 = Descriptor::enum_type(descriptor,iVar2);
    proto_00 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                         (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,iVar2);
    Visit<google::protobuf::EnumDescriptorProto>(this,descriptor_00,proto_00);
  }
  for (iVar2 = 0; iVar2 < descriptor->oneof_decl_count_; iVar2 = iVar2 + 1) {
    Descriptor::oneof_decl(descriptor,iVar2);
    RepeatedPtrFieldBase::
    Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
              (&(proto->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,iVar2);
  }
  for (iVar2 = 0; iVar2 < descriptor->field_count_; iVar2 = iVar2 + 1) {
    Descriptor::field(descriptor,iVar2);
    RepeatedPtrFieldBase::
    Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
              (&(proto->field_0)._impl_.field_.super_RepeatedPtrFieldBase,iVar2);
  }
  for (iVar2 = 0; iVar2 < descriptor->nested_type_count_; iVar2 = iVar2 + 1) {
    descriptor_01 = Descriptor::nested_type(descriptor,iVar2);
    proto_01 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&(proto->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,iVar2);
    Visit<google::protobuf::DescriptorProto>(this,descriptor_01,proto_01);
  }
  for (iVar2 = 0; iVar2 < descriptor->extension_count_; iVar2 = iVar2 + 1) {
    Descriptor::extension(descriptor,iVar2);
    RepeatedPtrFieldBase::
    Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
              (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,iVar2);
  }
  for (iVar2 = 0; iVar2 < descriptor->extension_range_count_; iVar2 = iVar2 + 1) {
    Descriptor::extension_range(descriptor,iVar2);
    RepeatedPtrFieldBase::
    Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
              (&(proto->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase,iVar2);
  }
  return;
}

Assistant:

void Visit(const Descriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);

    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.oneof_decl_count(); i++) {
      Visit(*descriptor.oneof_decl(i), oneof_decl(proto, i)...);
    }

    for (int i = 0; i < descriptor.field_count(); i++) {
      Visit(*descriptor.field(i), field(proto, i)...);
    }

    for (int i = 0; i < descriptor.nested_type_count(); i++) {
      Visit(*descriptor.nested_type(i), nested_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_range_count(); i++) {
      Visit(*descriptor.extension_range(i), extension_range(proto, i)...);
    }
  }